

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtracer-inl.h
# Opt level: O3

void __thiscall spdlog::details::backtracer::backtracer(backtracer *this,backtracer *other)

{
  size_t sVar1;
  size_type sVar2;
  size_t sVar3;
  int iVar4;
  
  (this->messages_).v_.
  super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->messages_).v_.
  super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->messages_).tail_ = 0;
  (this->messages_).overrun_counter_ = 0;
  (this->messages_).max_items_ = 0;
  (this->messages_).head_ = 0;
  (this->messages_).v_.
  super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev + 1) = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex.__data.__list.__next + 1) = 0;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)other);
  if (iVar4 == 0) {
    LOCK();
    (this->enabled_)._M_base._M_i = (__int_type)((other->enabled_)._M_base._M_i & 1);
    UNLOCK();
    sVar1 = (other->messages_).max_items_;
    sVar2 = (other->messages_).head_;
    sVar3 = (other->messages_).overrun_counter_;
    (this->messages_).tail_ = (other->messages_).tail_;
    (this->messages_).overrun_counter_ = sVar3;
    (this->messages_).max_items_ = sVar1;
    (this->messages_).head_ = sVar2;
    std::vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>::
    operator=((vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
               *)&(this->messages_).v_,&(other->messages_).v_);
    pthread_mutex_unlock((pthread_mutex_t *)other);
    return;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

SPDLOG_INLINE backtracer::backtracer(const backtracer &other) {
    std::lock_guard<std::mutex> lock(other.mutex_);
    enabled_ = other.enabled();
    messages_ = other.messages_;
}